

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O0

int CertVerifyCallback(X509_STORE_CTX *store_ctx,void *arg)

{
  bool bVar1;
  int idx;
  SSL *ssl_00;
  TestConfig *pTVar2;
  TestState *pTVar3;
  TestConfig *config;
  SSL *ssl;
  void *arg_local;
  X509_STORE_CTX *store_ctx_local;
  
  idx = SSL_get_ex_data_X509_STORE_CTX_idx();
  ssl_00 = (SSL *)X509_STORE_CTX_get_ex_data((X509_STORE_CTX *)store_ctx,idx);
  pTVar2 = GetTestConfig(ssl_00);
  bVar1 = CheckVerifyCallback(ssl_00);
  if (bVar1) {
    pTVar3 = GetTestState(ssl_00);
    pTVar3->cert_verified = true;
    if ((pTVar2->verify_fail & 1U) == 0) {
      store_ctx_local._4_4_ = 1;
    }
    else {
      X509_STORE_CTX_set_error((X509_STORE_CTX *)store_ctx,0x32);
      store_ctx_local._4_4_ = 0;
    }
  }
  else {
    store_ctx_local._4_4_ = 0;
  }
  return store_ctx_local._4_4_;
}

Assistant:

static int CertVerifyCallback(X509_STORE_CTX *store_ctx, void *arg) {
  SSL *ssl = (SSL *)X509_STORE_CTX_get_ex_data(
      store_ctx, SSL_get_ex_data_X509_STORE_CTX_idx());
  const TestConfig *config = GetTestConfig(ssl);
  if (!CheckVerifyCallback(ssl)) {
    return 0;
  }

  GetTestState(ssl)->cert_verified = true;
  if (config->verify_fail) {
    X509_STORE_CTX_set_error(store_ctx, X509_V_ERR_APPLICATION_VERIFICATION);
    return 0;
  }

  return 1;
}